

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

Id __thiscall spv::Builder::collapseAccessChain(Builder *this)

{
  uint base;
  pointer ppIVar1;
  Instruction *pIVar2;
  Id IVar3;
  
  if ((this->accessChain).isRValue != false) {
    __assert_fail("accessChain.isRValue == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.cpp"
                  ,0xa43,"Id spv::Builder::collapseAccessChain()");
  }
  if ((this->accessChain).indexChain.
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->accessChain).indexChain.
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    IVar3 = (this->accessChain).base;
  }
  else {
    IVar3 = (this->accessChain).instr;
    if (IVar3 == 0) {
      base = (this->accessChain).base;
      ppIVar1 = (this->module).idToInstruction.
                super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pIVar2 = ppIVar1[ppIVar1[base]->typeId];
      if (pIVar2->opCode != OpTypePointer) {
        __assert_fail("idToInstruction[typeId]->getOpCode() == spv::OpTypePointer",
                      "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/spvIR.h"
                      ,0x161,"StorageClass spv::Module::getStorageClass(Id) const");
      }
      IVar3 = createAccessChain(this,*(pIVar2->operands).
                                      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start,base,
                                &(this->accessChain).indexChain);
      (this->accessChain).instr = IVar3;
    }
  }
  return IVar3;
}

Assistant:

Id Builder::collapseAccessChain()
{
    assert(accessChain.isRValue == false);

    if (accessChain.indexChain.size() > 0) {
        if (accessChain.instr == 0) {
            StorageClass storageClass = (StorageClass)module.getStorageClass(getTypeId(accessChain.base));
            accessChain.instr = createAccessChain(storageClass, accessChain.base, accessChain.indexChain);
        }

        return accessChain.instr;
    } else
        return accessChain.base;

    // note that non-trivial swizzling is left pending...
}